

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O2

int i2d_X509(X509 *x509,uint8_t **outp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint8_t *out;
  CBB cert;
  ScopedCBB cbb;
  
  if (x509 == (X509 *)0x0) {
    ERR_put_error(0xc,0,0x9b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0xd9);
    iVar4 = -1;
  }
  else {
    CBB_zero(&cbb.ctx_);
    iVar1 = CBB_init(&cbb.ctx_,0x40);
    iVar4 = -1;
    if (iVar1 != 0) {
      iVar1 = CBB_add_asn1(&cbb.ctx_,&cert,0x20000010);
      if (iVar1 != 0) {
        uVar2 = i2d_X509_CINF((X509_CINF *)x509->cert_info,(uchar **)0x0);
        iVar4 = -1;
        if (-1 < (int)uVar2) {
          iVar1 = CBB_add_space(&cert,&out,(ulong)uVar2);
          if (iVar1 != 0) {
            uVar3 = i2d_X509_CINF((X509_CINF *)x509->cert_info,&out);
            if (uVar3 == uVar2) {
              iVar1 = x509_marshal_algorithm(&cert,x509->sig_alg);
              if (iVar1 != 0) {
                iVar1 = asn1_marshal_bit_string(&cert,x509->signature,0);
                if (iVar1 != 0) {
                  iVar4 = CBB_finish_i2d(&cbb.ctx_,outp);
                }
              }
            }
          }
        }
      }
    }
    CBB_cleanup(&cbb.ctx_);
  }
  return iVar4;
}

Assistant:

int i2d_X509(X509 *x509, uint8_t **outp) {
  if (x509 == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
    return -1;
  }

  bssl::ScopedCBB cbb;
  CBB cert;
  if (!CBB_init(cbb.get(), 64) ||  //
      !CBB_add_asn1(cbb.get(), &cert, CBS_ASN1_SEQUENCE)) {
    return -1;
  }

  // TODO(crbug.com/boringssl/443): When the rest of the library is decoupled
  // from the tasn_*.c implementation, replace this with |CBS|-based functions.
  uint8_t *out;
  int len = i2d_X509_CINF(x509->cert_info, NULL);
  if (len < 0 ||  //
      !CBB_add_space(&cert, &out, static_cast<size_t>(len)) ||
      i2d_X509_CINF(x509->cert_info, &out) != len ||
      !x509_marshal_algorithm(&cert, x509->sig_alg) ||
      !asn1_marshal_bit_string(&cert, x509->signature, /*tag=*/0)) {
    return -1;
  }

  return CBB_finish_i2d(cbb.get(), outp);
}